

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlep_interface.c
# Opt level: O2

int dlep_if_add(dlep_if *interf,char *ifname,oonf_layer2_origin *l2_origin,
               oonf_layer2_origin *l2_default_origin,_func_int_os_interface_listener_ptr *if_changed
               ,oonf_log_source log_src,_Bool radio)

{
  char *l2_ifname;
  autobuf *out;
  list_entity *plVar1;
  int iVar2;
  int iVar3;
  avl_tree *paVar4;
  avl_node *paVar5;
  avl_tree *paVar6;
  
  l2_ifname = interf->l2_ifname;
  strscpy(l2_ifname,ifname,0x10);
  (interf->_node).key = l2_ifname;
  out = &interf->udp_out;
  iVar2 = abuf_init(out);
  iVar3 = -1;
  if (iVar2 == 0) {
    abuf_memcpy(out,"DLEP",4);
    iVar3 = dlep_session_add(&interf->session,l2_ifname,l2_origin,l2_default_origin,out,radio,
                             if_changed,log_src);
    if (iVar3 == 0) {
      interf->radio = radio;
      avl_init(&interf->session_tree,avl_comp_netaddr_socket,0);
      (interf->udp).config.user = interf;
      (interf->udp).config.receive_data = _cb_receive_udp;
      oonf_packet_add_managed(&interf->udp);
      (interf->session).cb_send_buffer = _cb_send_multicast;
      (interf->session).cb_end_session = (_func_void_dlep_session_ptr *)0x0;
      (interf->session).restrict_signal = DLEP_UDP_PEER_OFFER - (uint)radio;
      (interf->session).writer.out = out;
      paVar6 = &_router_if_tree;
      if (radio) {
        paVar6 = &_radio_if_tree;
      }
      avl_insert(paVar6,&interf->_node);
      paVar6 = dlep_extension_get_tree();
      while( true ) {
        paVar6 = (avl_tree *)(paVar6->list_head).next;
        plVar1 = (paVar6->list_head).prev;
        paVar4 = dlep_extension_get_tree();
        if (plVar1 == (paVar4->list_head).prev) break;
        if (radio) {
          paVar5 = paVar6[-2].root;
        }
        else {
          paVar5 = *(avl_node **)&paVar6[-2].count;
        }
        if (paVar5 != (avl_node *)0x0) {
          (*(code *)paVar5)(interf);
        }
      }
      iVar3 = 0;
    }
    else {
      abuf_free(out);
      iVar3 = -1;
    }
  }
  return iVar3;
}

Assistant:

int
dlep_if_add(struct dlep_if *interf, const char *ifname, const struct oonf_layer2_origin *l2_origin,
  const struct oonf_layer2_origin *l2_default_origin,
  int (*if_changed)(struct os_interface_listener *), enum oonf_log_source log_src, bool radio) {
  struct dlep_extension *ext;

  /* initialize key */
  strscpy(interf->l2_ifname, ifname, sizeof(interf->l2_ifname));
  interf->_node.key = interf->l2_ifname;

  if (abuf_init(&interf->udp_out)) {
    return -1;
  }

  /* add dlep prefix to buffer */
  abuf_memcpy(&interf->udp_out, _DLEP_PREFIX, sizeof(_DLEP_PREFIX) - 1);

  if (dlep_session_add(&interf->session, interf->l2_ifname,
    l2_origin, l2_default_origin, &interf->udp_out, radio, if_changed, log_src)) {
    abuf_free(&interf->udp_out);
    return -1;
  }

  /* remember if this is a radio interface */
  interf->radio = radio;

  /* initialize stream list */
  avl_init(&interf->session_tree, avl_comp_netaddr_socket, false);

  /* initialize discovery socket */
  interf->udp.config.user = interf;
  interf->udp.config.receive_data = _cb_receive_udp;
  oonf_packet_add_managed(&interf->udp);

  /* initialize session */
  interf->session.cb_send_buffer = _cb_send_multicast;
  interf->session.cb_end_session = NULL;
  interf->session.restrict_signal = radio ? DLEP_UDP_PEER_DISCOVERY : DLEP_UDP_PEER_OFFER;
  interf->session.writer.out = &interf->udp_out;

  /* add to tree */
  avl_insert(dlep_if_get_tree(radio), &interf->_node);

  /* inform all extension */
  avl_for_each_element(dlep_extension_get_tree(), ext, _node) {
    if (radio) {
      if (ext->cb_session_init_radio) {
        ext->cb_session_init_radio(&interf->session);
      }
    }
    else {
      if (ext->cb_session_init_router) {
        ext->cb_session_init_router(&interf->session);
      }
    }
  }
  return 0;
}